

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

ExtensionRange * __thiscall
google::protobuf::Descriptor::FindExtensionRangeContainingNumber(Descriptor *this,int number)

{
  ExtensionRange *pEVar1;
  long lVar2;
  
  lVar2 = (long)this->extension_range_count_;
  if (0 < lVar2) {
    pEVar1 = this->extension_ranges_;
    do {
      if ((pEVar1->start_ <= number) && (number < pEVar1->end_)) {
        return pEVar1;
      }
      pEVar1 = pEVar1 + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  return (ExtensionRange *)0x0;
}

Assistant:

const Descriptor::ExtensionRange*
Descriptor::FindExtensionRangeContainingNumber(int number) const {
  // Linear search should be fine because we don't expect a message to have
  // more than a couple extension ranges.
  for (int i = 0; i < extension_range_count(); i++) {
    if (number >= extension_range(i)->start_number() &&
        number < extension_range(i)->end_number()) {
      return extension_range(i);
    }
  }
  return nullptr;
}